

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_parallel_game_of_life.cpp
# Opt level: O0

void __thiscall App::ResizeTables(App *this,int w,int h)

{
  reference pvVar1;
  anon_class_1_0_00000001 local_13c1;
  anon_class_16_2_7fa271ba local_13c0;
  uniform_real_distribution<float> local_13b0;
  uniform_real_distribution<float> d;
  mt19937 mt;
  int local_18;
  int local_14;
  int h_local;
  int w_local;
  App *this_local;
  
  if ((w < 0) || (local_18 = h, local_14 = w, h < 0)) {
    local_18 = 0;
    local_14 = 0;
  }
  this->idx = 0;
  pvVar1 = std::array<Table2D<char>,_2UL>::operator[](&this->table,0);
  mt._M_p._7_1_ = 0;
  Table2D<char>::resize(pvVar1,local_14,local_18,(char *)((long)&mt._M_p + 7));
  pvVar1 = std::array<Table2D<char>,_2UL>::operator[](&this->table,1);
  mt._M_p._6_1_ = 0;
  Table2D<char>::resize(pvVar1,local_14,local_18,(char *)((long)&mt._M_p + 6));
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&d,0x2a);
  std::uniform_real_distribution<float>::uniform_real_distribution(&local_13b0,0.0,1.0);
  pvVar1 = std::array<Table2D<char>,_2UL>::operator[](&this->table,0);
  local_13c0.d = &local_13b0;
  local_13c0.mt = (mt19937 *)&d;
  Table2D<char>::fill1<App::ResizeTables(int,int)::_lambda(int)_1_>(pvVar1,&local_13c0);
  pvVar1 = std::array<Table2D<char>,_2UL>::operator[](&this->table,1);
  Table2D<char>::fill1<App::ResizeTables(int,int)::_lambda(int)_2_>(pvVar1,&local_13c1);
  return;
}

Assistant:

void ResizeTables(int w, int h)
	{
		if(w < 0 || h < 0){ w = h = 0; }
		idx = 0;
		table[0].resize(w, h);
		table[1].resize(w, h);

		{
			std::mt19937 mt(42);
			std::uniform_real_distribution<float> d(0.0, 1.0f);
			table[0].fill1([&](int)->char{ return d(mt) < 0.5 ? 0 : 1; }); 
			table[1].fill1([ ](int)->char{ return 0; });
		}
	}